

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

bool __thiscall QFileSystemModel::isDir(QFileSystemModel *this,QModelIndex *index)

{
  QExtendedInformation *this_00;
  Type TVar1;
  long in_FS_OFFSET;
  undefined1 uVar2;
  QFileInfo local_20 [8];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 1;
  if (((-1 < index->r) && (-1 < index->c)) && ((index->m).ptr != (QAbstractItemModel *)0x0)) {
    this_00 = *(QExtendedInformation **)(index->i + 0x38);
    if (this_00 == (QExtendedInformation *)0x0) {
      fileInfo((QFileSystemModel *)local_20,(QModelIndex *)this);
      uVar2 = QFileInfo::isDir();
      QFileInfo::~QFileInfo(local_20);
    }
    else {
      TVar1 = QExtendedInformation::type(this_00);
      uVar2 = TVar1 == Dir;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemModel::isDir(const QModelIndex &index) const
{
    // This function is for public usage only because it could create a file info
    Q_D(const QFileSystemModel);
    if (!index.isValid())
        return true;
    QFileSystemModelPrivate::QFileSystemNode *n = d->node(index);
    if (n->hasInformation())
        return n->isDir();
    return fileInfo(index).isDir();
}